

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O2

void ComputeGNSSPosition(double Latitude,double Longitude,double Altitude,int GNSSquality,int nbSat,
                        double HDOP)

{
  double *pdVar1;
  double z;
  double y;
  double x;
  double local_70;
  double local_68;
  interval local_60;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_30 = HDOP;
  GPS2EnvCoordSystem(lat_env,long_env,alt_env,angle_env,Latitude,Longitude,Altitude,&local_38,
                     &local_40,&local_48);
  if (GNSSquality - 1U < 2) {
    if ((nbSat < GPS_high_acc_nbsat) || (GPS_high_acc_HDOP < local_30)) {
      if (nbSat < GPS_med_acc_nbsat) {
        if (0 < nbSat) {
LAB_0013ad95:
          if ((nbSat < GPS_low_acc_nbsat) || (GPS_low_acc_HDOP < local_30)) {
            local_68 = local_38 + -10000.0;
            local_70 = local_38 + 10000.0;
            interval::interval(&local_60,&local_68,&local_70);
            interval::operator=((interval *)&x_gps,&local_60);
            local_68 = local_40 + -10000.0;
            local_70 = local_40 + 10000.0;
            interval::interval(&local_60,&local_68,&local_70);
            interval::operator=((interval *)&y_gps,&local_60);
            local_68 = local_48 + -50000.0;
            local_70 = local_48 + 50000.0;
            goto LAB_0013ae9d;
          }
          goto LAB_0013adbb;
        }
      }
      else if ((0 < nbSat) && (GPS_med_acc_HDOP < local_30)) goto LAB_0013ad95;
      pdVar1 = &GPS_med_acc;
    }
    else {
      pdVar1 = &GPS_high_acc;
    }
  }
  else if (GNSSquality == 4) {
    if ((0 < nbSat && nbSat < GPS_med_acc_nbsat) || (GPS_med_acc_HDOP < local_30)) {
LAB_0013adbb:
      pdVar1 = &GPS_low_acc;
    }
    else {
      pdVar1 = &RTK_fixed_acc;
    }
  }
  else {
    if (GNSSquality != 5) {
      local_68 = -10000.0;
      local_70 = 10000.0;
      interval::interval(&local_60,&local_68,&local_70);
      interval::operator=((interval *)&x_gps,&local_60);
      local_68 = -10000.0;
      local_70 = 10000.0;
      interval::interval(&local_60,&local_68,&local_70);
      interval::operator=((interval *)&y_gps,&local_60);
      local_68 = -10000.0;
      local_70 = 10000.0;
      goto LAB_0013ae9d;
    }
    if ((0 < nbSat && nbSat < GPS_med_acc_nbsat) || (GPS_med_acc_HDOP < local_30))
    goto LAB_0013adbb;
    pdVar1 = &RTK_float_acc;
  }
  local_68 = local_38 - *pdVar1;
  local_70 = local_38 + *pdVar1;
  interval::interval(&local_60,&local_68,&local_70);
  interval::operator=((interval *)&x_gps,&local_60);
  local_68 = local_40 - *pdVar1;
  local_70 = local_40 + *pdVar1;
  interval::interval(&local_60,&local_68,&local_70);
  interval::operator=((interval *)&y_gps,&local_60);
  local_68 = *pdVar1 * -5.0 + local_48;
  local_70 = *pdVar1 * 5.0 + local_48;
LAB_0013ae9d:
  interval::interval(&local_60,&local_68,&local_70);
  interval::operator=((interval *)&z_gps,&local_60);
  return;
}

Assistant:

inline void ComputeGNSSPosition(double Latitude, double Longitude, double Altitude, int GNSSquality, int nbSat, double HDOP)
{
	double x = 0, y = 0, z = 0;

	GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, Latitude, Longitude, Altitude, &x, &y, &z);
	switch (GNSSquality)
	{
	case AUTONOMOUS_GNSS_FIX:
	case DIFFERENTIAL_GNSS_FIX:
		if ((nbSat >= GPS_high_acc_nbsat)&&(HDOP <= GPS_high_acc_HDOP))
		{
			x_gps = interval(x-GPS_high_acc, x+GPS_high_acc);
			y_gps = interval(y-GPS_high_acc, y+GPS_high_acc);
			z_gps = interval(z-5.0*GPS_high_acc, z+5.0*GPS_high_acc);
		}
		else if (((nbSat >= GPS_med_acc_nbsat)&&(HDOP <= GPS_med_acc_HDOP))||(nbSat <= 0))
		{
			// Default accuracy...
			x_gps = interval(x-GPS_med_acc, x+GPS_med_acc);
			y_gps = interval(y-GPS_med_acc, y+GPS_med_acc);
			z_gps = interval(z-5.0*GPS_med_acc, z+5.0*GPS_med_acc);
		}
		else if ((nbSat >= GPS_low_acc_nbsat)&&(HDOP <= GPS_low_acc_HDOP))
		{
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-MAX_UNCERTAINTY, x+MAX_UNCERTAINTY);
			y_gps = interval(y-MAX_UNCERTAINTY, y+MAX_UNCERTAINTY);
			z_gps = interval(z-5.0*MAX_UNCERTAINTY, z+5.0*MAX_UNCERTAINTY);
		}
		break;
	case RTK_FLOAT:
		if (((nbSat < GPS_med_acc_nbsat)&&(nbSat > 0))||(HDOP > GPS_med_acc_HDOP))
		{
			// Probably about to lose GPS soon...
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-RTK_float_acc, x+RTK_float_acc);
			y_gps = interval(y-RTK_float_acc, y+RTK_float_acc);
			z_gps = interval(z-5.0*RTK_float_acc, z+5.0*RTK_float_acc);
		}
		break;
	case RTK_FIXED:
		if (((nbSat < GPS_med_acc_nbsat)&&(nbSat > 0))||(HDOP > GPS_med_acc_HDOP))
		{
			// Probably about to lose GPS soon...
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-RTK_fixed_acc, x+RTK_fixed_acc);
			y_gps = interval(y-RTK_fixed_acc, y+RTK_fixed_acc);
			z_gps = interval(z-5.0*RTK_fixed_acc, z+5.0*RTK_fixed_acc);
		}
		break;
	case GNSS_NO_FIX:
	case GNSS_ESTIMATED_FIX:
	default:
		x_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		y_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		z_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		break;
	}
}